

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_dec_ref_pic_marking(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  int local_24;
  int n;
  slice_header_t *sh;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sh;
  if (h->nal->nal_unit_type == 5) {
    uVar2 = bs_read_u1(b);
    (psVar1->drpm).no_output_of_prior_pics_flag = uVar2;
    uVar2 = bs_read_u1(b);
    (psVar1->drpm).long_term_reference_flag = uVar2;
  }
  else {
    uVar2 = bs_read_u1(b);
    (psVar1->drpm).adaptive_ref_pic_marking_mode_flag = uVar2;
    if ((psVar1->drpm).adaptive_ref_pic_marking_mode_flag != 0) {
      local_24 = -1;
      do {
        local_24 = local_24 + 1;
        uVar2 = bs_read_ue(b);
        (psVar1->drpm).memory_management_control_operation[local_24] = uVar2;
        if (((psVar1->drpm).memory_management_control_operation[local_24] == 1) ||
           ((psVar1->drpm).memory_management_control_operation[local_24] == 3)) {
          uVar2 = bs_read_ue(b);
          (psVar1->drpm).difference_of_pic_nums_minus1[local_24] = uVar2;
        }
        if ((psVar1->drpm).memory_management_control_operation[local_24] == 2) {
          uVar2 = bs_read_ue(b);
          (psVar1->drpm).long_term_pic_num[local_24] = uVar2;
        }
        if (((psVar1->drpm).memory_management_control_operation[local_24] == 3) ||
           ((psVar1->drpm).memory_management_control_operation[local_24] == 6)) {
          uVar2 = bs_read_ue(b);
          (psVar1->drpm).long_term_frame_idx[local_24] = uVar2;
        }
        if ((psVar1->drpm).memory_management_control_operation[local_24] == 4) {
          uVar2 = bs_read_ue(b);
          (psVar1->drpm).max_long_term_frame_idx_plus1[local_24] = uVar2;
        }
        bVar4 = false;
        if ((psVar1->drpm).memory_management_control_operation[local_24] != 0) {
          iVar3 = bs_eof(b);
          bVar4 = iVar3 == 0;
        }
      } while (bVar4);
    }
  }
  return;
}

Assistant:

void read_dec_ref_pic_marking(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( h->nal->nal_unit_type == 5 )
    {
        sh->drpm.no_output_of_prior_pics_flag = bs_read_u1(b);
        sh->drpm.long_term_reference_flag = bs_read_u1(b);
    }
    else
    {
        sh->drpm.adaptive_ref_pic_marking_mode_flag = bs_read_u1(b);
        if( sh->drpm.adaptive_ref_pic_marking_mode_flag )
        {
            int n = -1;
            do
            {
                n++;
                sh->drpm.memory_management_control_operation[ n ] = bs_read_ue(b);
                if( sh->drpm.memory_management_control_operation[ n ] == 1 ||
                    sh->drpm.memory_management_control_operation[ n ] == 3 )
                {
                    sh->drpm.difference_of_pic_nums_minus1[ n ] = bs_read_ue(b);
                }
                if(sh->drpm.memory_management_control_operation[ n ] == 2 )
                {
                    sh->drpm.long_term_pic_num[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 3 ||
                    sh->drpm.memory_management_control_operation[ n ] == 6 )
                {
                    sh->drpm.long_term_frame_idx[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 4 )
                {
                    sh->drpm.max_long_term_frame_idx_plus1[ n ] = bs_read_ue(b);
                }
            } while( sh->drpm.memory_management_control_operation[ n ] != 0 && ! bs_eof(b) );
        }
    }
}